

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

bool __thiscall ipx::Iterate::optimal(Iterate *this)

{
  int __x;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  bool is_optimal;
  double obj_measure;
  double abs_gap;
  double gap;
  double obj;
  double dobj;
  double pobj;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  Evaluate((Iterate *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  pobjective_after_postproc
            ((Iterate *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  __x = (int)in_RDI;
  dobjective_after_postproc
            ((Iterate *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  std::abs(__x);
  std::abs(__x);
  return extraout_XMM0_Qa <= *(double *)(in_RDI + 0x118) * (extraout_XMM0_Qa_00 + 1.0);
}

Assistant:

bool Iterate::optimal() const {
    Evaluate();
    double pobj = pobjective_after_postproc();
    double dobj = dobjective_after_postproc();
    double obj = 0.5 * (pobj + dobj);
    double gap = pobj - dobj;
    const double abs_gap = std::abs(gap);
    const double obj_measure = 1.0+std::abs(obj);
    const bool is_optimal = abs_gap <= optimality_tol_ * obj_measure;
    if (kTerminationLogging) {
      const double rel_gap = abs_gap / obj_measure; 
      printf("Iterate::optimal     abs_gap = %11.4g;"
	     " obj_measure    = %11.4g; rel_gap       = %11.4g;"
	     "  optimality_tol = %11.4g:   optimal       = %d\n",
	     abs_gap, obj_measure, rel_gap, optimality_tol_, is_optimal);
    }
    return is_optimal;
}